

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRules
          (pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *__return_storage_ptr__,
          Compilation *this,string_view lookupName,Scope *scope,ResolvedConfig *parentConfig,
          ConfigRule *rule,
          vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList)

{
  group_type_pointer pgVar1;
  ConfigBlockSymbol *this_00;
  value_type_pointer ppVar2;
  uint uVar3;
  byte bVar4;
  size_t __n;
  int iVar5;
  uint uVar6;
  ConfigRule *rule_00;
  DefinitionSymbol *pDVar7;
  uint64_t uVar8;
  ulong uVar9;
  pointer ppSVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  size_type __rlen;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  size_t pos;
  CellOverride *cellOverride;
  optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> result;
  anon_class_40_5_c3c3317d findDefWithOverride;
  ulong local_f8;
  CellOverride *local_d8;
  group_type_pointer local_d0;
  ulong local_c8;
  char *local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  _Storage<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>,_true> local_a8;
  char local_88;
  anon_class_40_5_c3c3317d local_80;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  rule_00 = rule;
  local_b8._M_str = lookupName._M_str;
  local_b8._M_len = lookupName._M_len;
  local_d8 = (CellOverride *)0x0;
  ppSVar10 = (pointer)0x0;
  if (parentConfig == (ResolvedConfig *)0x0) {
    sVar13 = 0;
  }
  else {
    this_00 = parentConfig->useConfig;
    ppSVar10 = (parentConfig->liblist)._M_ptr;
    sVar13 = (parentConfig->liblist)._M_extent._M_extent_value;
    if (this_00->resolved == false) {
      ConfigBlockSymbol::resolve(this_00);
    }
    uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                      ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                       &this_00->cellOverrides,&local_b8);
    __n = local_b8._M_len;
    uVar11 = uVar8 >> ((byte)(this_00->cellOverrides).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                             .arrays.groups_size_index & 0x3f);
    local_d0 = (this_00->cellOverrides).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
               .arrays.groups_;
    lVar12 = (uVar8 & 0xff) * 4;
    uVar15 = (&UNK_00474b6c)[lVar12];
    uVar16 = (&UNK_00474b6d)[lVar12];
    uVar17 = (&UNK_00474b6e)[lVar12];
    bVar18 = (&UNK_00474b6f)[lVar12];
    local_c0 = local_b8._M_str;
    local_c8 = (ulong)((uint)uVar8 & 7);
    local_f8 = 0;
    uVar19 = uVar15;
    uVar20 = uVar16;
    uVar21 = uVar17;
    bVar22 = bVar18;
    uVar23 = uVar15;
    uVar24 = uVar16;
    uVar25 = uVar17;
    bVar26 = bVar18;
    uVar27 = uVar15;
    uVar28 = uVar16;
    uVar29 = uVar17;
    bVar30 = bVar18;
    do {
      pgVar1 = local_d0 + uVar11;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bVar4 = pgVar1->m[0xf].n;
      auVar14[0] = -(local_48 == uVar15);
      auVar14[1] = -(uStack_47 == uVar16);
      auVar14[2] = -(uStack_46 == uVar17);
      auVar14[3] = -(bStack_45 == bVar18);
      auVar14[4] = -(uStack_44 == uVar19);
      auVar14[5] = -(uStack_43 == uVar20);
      auVar14[6] = -(uStack_42 == uVar21);
      auVar14[7] = -(bStack_41 == bVar22);
      auVar14[8] = -(uStack_40 == uVar23);
      auVar14[9] = -(uStack_3f == uVar24);
      auVar14[10] = -(uStack_3e == uVar25);
      auVar14[0xb] = -(bStack_3d == bVar26);
      auVar14[0xc] = -(uStack_3c == uVar27);
      auVar14[0xd] = -(uStack_3b == uVar28);
      auVar14[0xe] = -(uStack_3a == uVar29);
      auVar14[0xf] = -(bVar4 == bVar30);
      uVar6 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      bStack_39 = bVar4;
      if (uVar6 != 0) {
        ppVar2 = (this_00->cellOverrides).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                 .arrays.elements_;
        local_58 = uVar15;
        uStack_57 = uVar16;
        uStack_56 = uVar17;
        bStack_55 = bVar18;
        uStack_54 = uVar19;
        uStack_53 = uVar20;
        uStack_52 = uVar21;
        bStack_51 = bVar22;
        uStack_50 = uVar23;
        uStack_4f = uVar24;
        uStack_4e = uVar25;
        bStack_4d = bVar26;
        uStack_4c = uVar27;
        uStack_4b = uVar28;
        uStack_4a = uVar29;
        bStack_49 = bVar30;
        do {
          uVar3 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar9 = (ulong)uVar3;
          if ((__n == ppVar2[uVar11 * 0xf + uVar9].first._M_len) &&
             ((__n == 0 ||
              (iVar5 = bcmp(local_c0,ppVar2[uVar11 * 0xf + uVar9].first._M_str,__n),
              uVar15 = local_58, uVar16 = uStack_57, uVar17 = uStack_56, bVar18 = bStack_55,
              uVar19 = uStack_54, uVar20 = uStack_53, uVar21 = uStack_52, bVar22 = bStack_51,
              uVar23 = uStack_50, uVar24 = uStack_4f, uVar25 = uStack_4e, bVar26 = bStack_4d,
              uVar27 = uStack_4c, uVar28 = uStack_4b, uVar29 = uStack_4a, bVar30 = bStack_49,
              iVar5 == 0)))) {
            local_d8 = &ppVar2[uVar11 * 0xf + uVar9].second;
            rule_00 = ppVar2[uVar11 * 0xf + uVar9].second.defaultRule;
            rule = rule_00;
            goto LAB_0013f1a8;
          }
          uVar6 = uVar6 - 1 & uVar6;
        } while (uVar6 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_c8] & bVar4) == 0) break;
      uVar9 = (this_00->cellOverrides).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
              .arrays.groups_size_mask;
      lVar12 = uVar11 + local_f8;
      local_f8 = local_f8 + 1;
      uVar11 = lVar12 + 1U & uVar9;
    } while (local_f8 <= uVar9);
  }
LAB_0013f1a8:
  if (rule_00 != (ConfigRule *)0x0) {
    if ((rule_00->useCell).name._M_len != 0) {
      resolveConfigRule(__return_storage_ptr__,this,scope,rule_00);
      return __return_storage_ptr__;
    }
    rule_00->isUsed = true;
    if ((rule_00->liblist).
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_engaged == true) {
      ppSVar10 = (rule_00->liblist).
                 super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                 ._M_payload._M_value._M_ptr;
      sVar13 = *(size_t *)
                ((long)&(rule_00->liblist).
                        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                        ._M_payload + 8);
    }
  }
  local_80.cellOverride = &local_d8;
  local_80.defList = defList;
  local_80.rule = &rule;
  local_80.this = this;
  local_80.scope = scope;
  if (sVar13 == 0) {
    pDVar7 = Symbol::getDeclaringDefinition(scope->thisSym);
    if ((pDVar7 != (DefinitionSymbol *)0x0) &&
       (resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                  ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> *)
                   &local_a8._M_value,&local_80,pDVar7->sourceLibrary), local_88 == '\x01')) {
LAB_0013f287:
      (__return_storage_ptr__->first).configRule = local_a8._M_value.first.configRule;
      *(undefined8 *)&__return_storage_ptr__->second = local_a8._24_8_;
      goto LAB_0013f2a6;
    }
  }
  else {
    lVar12 = 0;
    do {
      resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> *)
                 &local_a8._M_value,&local_80,*(SourceLibrary **)((long)ppSVar10 + lVar12));
      if (local_88 == '\x01') goto LAB_0013f287;
      lVar12 = lVar12 + 8;
    } while (sVar13 * 8 != lVar12);
  }
  local_a8._M_value.first.definition = (Symbol *)0x0;
  local_a8._M_value.first.configRoot = (ConfigBlockSymbol *)0x0;
  *(undefined1 (*) [16])((long)&(__return_storage_ptr__->first).configRoot + 1) =
       (undefined1  [16])0x0;
LAB_0013f2a6:
  (__return_storage_ptr__->first).definition = local_a8._M_value.first.definition;
  (__return_storage_ptr__->first).configRoot = local_a8._M_value.first.configRoot;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRules(
    std::string_view lookupName, const Scope& scope, const ResolvedConfig* parentConfig,
    const ConfigRule* rule, const std::vector<Symbol*>& defList) const {

    const ConfigBlockSymbol::CellOverride* cellOverride = nullptr;
    std::span<const SourceLibrary* const> liblist;
    if (parentConfig) {
        SLANG_ASSERT(!rule);
        liblist = parentConfig->liblist;

        auto& conf = parentConfig->useConfig;
        auto& overrides = conf.getCellOverrides();
        if (auto overrideIt = overrides.find(lookupName); overrideIt != overrides.end()) {
            cellOverride = &overrideIt->second;
            rule = cellOverride->defaultRule;
        }
    }

    if (rule) {
        if (auto& id = rule->useCell; !id.name.empty())
            return resolveConfigRule(scope, *rule);

        rule->isUsed = true;
        if (rule->liblist)
            liblist = *rule->liblist;
    }

    auto findDefWithOverride = [&](const SourceLibrary& targetLib)
        -> std::optional<std::pair<Compilation::DefinitionLookupResult, bool>> {
        // If we have a cell override that specifically targets
        // this lib then we should just return that directly.
        if (cellOverride) {
            if (auto it = cellOverride->specificLibRules.find(&targetLib);
                it != cellOverride->specificLibRules.end()) {
                return resolveConfigRule(scope, *it->second);
            }
        }

        // Otherwise try to find the def in our list.
        if (auto def = findDefByLib(defList, targetLib)) {
            return std::pair<Compilation::DefinitionLookupResult, bool>{{def, nullptr, rule},
                                                                        false};
        }
        return std::nullopt;
    };

    if (!liblist.empty()) {
        // This search is O(n^2) but both lists should be small
        // (or even just one element each) in basically all cases.
        for (auto lib : liblist) {
            if (auto result = findDefWithOverride(*lib))
                return *result;
        }
    }
    else if (auto parentDef = scope.asSymbol().getDeclaringDefinition()) {
        // Fall back to picking based on the parent instance's library.
        if (auto result = findDefWithOverride(parentDef->sourceLibrary))
            return *result;
    }

    return {{}, false};
}